

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O0

char * uo_json_find_str_end(char *json_str)

{
  char *local_28;
  _Bool local_19;
  char *local_18;
  char *quote;
  char *json_str_local;
  
  local_18 = strchr(json_str + 1,0x22);
  while( true ) {
    local_19 = false;
    if (local_18 != (char *)0x0) {
      local_19 = uo_json_is_char_escaped(local_18);
    }
    if (local_19 == false) break;
    local_18 = strchr(local_18 + 1,0x22);
  }
  if (local_18 == (char *)0x0) {
    local_28 = (char *)0x0;
  }
  else {
    local_28 = local_18 + 1;
  }
  return local_28;
}

Assistant:

static char *uo_json_find_str_end(
    const char *json_str)
{
    const char *quote = strchr(json_str + 1, '\"');

    while (quote && uo_json_is_char_escaped(quote))
        quote = strchr(quote + 1, '\"');

    return quote
        ? (char *)quote + 1
        : NULL;
}